

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  size_type sVar4;
  Mat *this_00;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  double dVar8;
  float *outptr_1;
  int i_4;
  Mat *roi_score_blob;
  float *outptr;
  int i_3;
  Mat *roi_blob;
  int picked_count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  Rect r;
  float pb_h_1;
  float pb_w_1;
  float *pb_2;
  int i_2;
  float *scoreptr;
  Mat pbs_2;
  int q_2;
  float min_boxsize;
  float im_scale;
  vector<float,_std::allocator<float>_> scores;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  float *pb_1;
  int i_1;
  Mat pbs_1;
  int q_1;
  float im_h;
  float im_w;
  float pb_h;
  float pb_w;
  float pb_cy;
  float pb_cx;
  float cy;
  float cx;
  float dh;
  float dw;
  float dy;
  float dx;
  float *pb;
  int j;
  float anchor_x;
  int i;
  float anchor_h;
  float anchor_w;
  float anchor_y;
  float *anchor;
  Mat pbs;
  float *bbox_hptr;
  float *bbox_wptr;
  float *bbox_yptr;
  float *bbox_xptr;
  int q;
  Mat proposals;
  int num_anchors;
  int h;
  int w;
  Mat *im_info_blob;
  Mat *bbox_blob;
  Mat *score_blob;
  Mat *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffa20;
  int in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa2c;
  int iVar9;
  Mat *in_stack_fffffffffffffa30;
  Mat *this_01;
  Mat *in_stack_fffffffffffffa38;
  float in_stack_fffffffffffffac4;
  float in_stack_fffffffffffffac8;
  float in_stack_fffffffffffffacc;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *in_stack_fffffffffffffad0;
  Mat local_4e8;
  float *local_4a0;
  int local_494;
  reference local_490;
  Mat local_488;
  vector<float,_std::allocator<float>_> *local_440;
  int local_438;
  undefined4 local_434;
  reference local_430;
  int local_428;
  int local_424;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_420;
  float local_408;
  float local_404;
  float local_400;
  float local_3fc;
  float local_3f8;
  float local_3f4;
  float *local_3f0;
  int local_3e4;
  Mat local_3e0;
  float *local_398;
  Mat local_390;
  int local_344;
  float local_340;
  float local_33c;
  vector<float,_std::allocator<float>_> local_338;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_320;
  float local_308;
  float local_304;
  float local_300;
  float local_2fc;
  float local_2f8;
  float local_2f4;
  float local_2f0;
  float local_2ec;
  float *local_2e8;
  int local_2dc;
  Mat local_2d8;
  int local_28c;
  float local_288;
  float local_284;
  float local_280;
  float local_27c;
  float local_278;
  float local_274;
  float local_270;
  float local_26c;
  float local_268;
  float local_264;
  float local_260;
  float local_25c;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *local_258;
  int local_250;
  float local_24c;
  int local_248;
  float local_244;
  float local_240;
  float local_23c;
  float *local_238;
  Mat local_230;
  Mat local_1e8;
  float *local_1a0;
  Mat local_198;
  float *local_150;
  Mat local_148;
  float *local_100;
  Mat local_f8;
  float *local_b0;
  int local_a8;
  Mat local_98;
  int local_4c;
  int local_48;
  int local_44;
  const_reference local_40;
  const_reference local_38;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
  local_44 = local_30->w;
  local_48 = local_30->h;
  local_4c = *(int *)(in_RDI + 0x1a8);
  ncnn::Mat::Mat(&local_98);
  ncnn::Mat::create(in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28,
                    (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                    CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                    (Allocator *)in_stack_fffffffffffffa10);
  for (local_a8 = 0; local_a8 < local_4c; local_a8 = local_a8 + 1) {
    ncnn::Mat::channel(in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20));
    pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_f8);
    ncnn::Mat::~Mat((Mat *)0x4d2a4b);
    local_b0 = pfVar3;
    ncnn::Mat::channel(in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20));
    pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_148);
    ncnn::Mat::~Mat((Mat *)0x4d2aa6);
    local_100 = pfVar3;
    ncnn::Mat::channel(in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20));
    pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_198);
    ncnn::Mat::~Mat((Mat *)0x4d2b01);
    local_150 = pfVar3;
    ncnn::Mat::channel(in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20));
    pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_1e8);
    ncnn::Mat::~Mat((Mat *)0x4d2b5c);
    local_1a0 = pfVar3;
    ncnn::Mat::channel(in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20));
    local_238 = ncnn::Mat::row((Mat *)(in_RDI + 0x178),local_a8);
    local_23c = local_238[1];
    local_240 = local_238[2] - *local_238;
    local_244 = local_238[3] - local_238[1];
    for (local_248 = 0; local_248 < local_48; local_248 = local_248 + 1) {
      local_24c = *local_238;
      for (local_250 = 0; local_250 < local_44; local_250 = local_250 + 1) {
        in_stack_fffffffffffffad0 =
             (vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
             ncnn::Mat::row(&local_230,local_248 * local_44 + local_250);
        local_25c = local_b0[local_250];
        local_260 = local_100[local_250];
        local_264 = local_150[local_250];
        local_268 = local_1a0[local_250];
        local_26c = local_24c + local_240 * 0.5;
        local_270 = local_23c + local_244 * 0.5;
        local_274 = local_26c + local_240 * local_25c;
        local_278 = local_270 + local_244 * local_260;
        in_stack_fffffffffffffac8 = local_240;
        local_258 = in_stack_fffffffffffffad0;
        dVar8 = std::exp((double)(ulong)(uint)local_264);
        fVar1 = local_244;
        in_stack_fffffffffffffacc = SUB84(dVar8,0);
        local_27c = in_stack_fffffffffffffac8 * in_stack_fffffffffffffacc;
        dVar8 = std::exp((double)(ulong)(uint)local_268);
        in_stack_fffffffffffffac4 = SUB84(dVar8,0);
        local_280 = fVar1 * in_stack_fffffffffffffac4;
        *(float *)&(local_258->super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>)._M_impl.
                   super__Vector_impl_data._M_start = local_274 - local_27c * 0.5;
        *(float *)((long)&(local_258->super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>).
                          _M_impl.super__Vector_impl_data._M_start + 4) =
             local_278 - local_280 * 0.5;
        *(float *)&(local_258->super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>)._M_impl.
                   super__Vector_impl_data._M_finish = local_274 + local_27c * 0.5;
        *(float *)((long)&(local_258->super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>).
                          _M_impl.super__Vector_impl_data._M_finish + 4) =
             local_278 + local_280 * 0.5;
        local_24c = (float)*(int *)(in_RDI + 0xd0) + local_24c;
      }
      local_b0 = local_b0 + local_44;
      local_100 = local_100 + local_44;
      local_150 = local_150 + local_44;
      local_1a0 = local_1a0 + local_44;
      local_23c = (float)*(int *)(in_RDI + 0xd0) + local_23c;
    }
    ncnn::Mat::~Mat((Mat *)0x4d30e3);
  }
  pfVar3 = ncnn::Mat::operator[](local_40,1);
  local_284 = *pfVar3;
  pfVar3 = ncnn::Mat::operator[](local_40,0);
  local_288 = *pfVar3;
  for (local_28c = 0; local_28c < local_4c; local_28c = local_28c + 1) {
    ncnn::Mat::channel(in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20));
    for (local_2dc = 0; local_2dc < local_44 * local_48; local_2dc = local_2dc + 1) {
      local_2e8 = ncnn::Mat::row(&local_2d8,local_2dc);
      local_2ec = local_284 + -1.0;
      pfVar3 = std::min<float>(local_2e8,&local_2ec);
      local_2f0 = 0.0;
      pfVar3 = std::max<float>(pfVar3,&local_2f0);
      *local_2e8 = *pfVar3;
      local_2f4 = local_288 + -1.0;
      pfVar3 = std::min<float>(local_2e8 + 1,&local_2f4);
      local_2f8 = 0.0;
      pfVar3 = std::max<float>(pfVar3,&local_2f8);
      local_2e8[1] = *pfVar3;
      local_2fc = local_284 + -1.0;
      pfVar3 = std::min<float>(local_2e8 + 2,&local_2fc);
      local_300 = 0.0;
      pfVar3 = std::max<float>(pfVar3,&local_300);
      local_2e8[2] = *pfVar3;
      local_304 = local_288 + -1.0;
      pfVar3 = std::min<float>(local_2e8 + 3,&local_304);
      local_308 = 0.0;
      pfVar3 = std::max<float>(pfVar3,&local_308);
      local_2e8[3] = *pfVar3;
    }
    ncnn::Mat::~Mat((Mat *)0x4d342a);
  }
  std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::vector
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)0x4d344d);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x4d345a);
  pfVar3 = ncnn::Mat::operator[](local_40,2);
  local_33c = *pfVar3;
  local_340 = (float)*(int *)(in_RDI + 0xe4) * local_33c;
  for (local_344 = 0; local_344 < local_4c; local_344 = local_344 + 1) {
    ncnn::Mat::channel(in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20));
    ncnn::Mat::channel(in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20));
    pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_3e0);
    ncnn::Mat::~Mat((Mat *)0x4d352c);
    local_398 = pfVar3;
    for (local_3e4 = 0; local_3e4 < local_44 * local_48; local_3e4 = local_3e4 + 1) {
      local_3f0 = ncnn::Mat::row(&local_390,local_3e4);
      local_3f4 = (local_3f0[2] - *local_3f0) + 1.0;
      local_3f8 = (local_3f0[3] - local_3f0[1]) + 1.0;
      if ((local_340 <= local_3f4) && (local_340 <= local_3f8)) {
        local_408 = *local_3f0;
        local_404 = local_3f0[1];
        local_400 = local_3f0[2];
        local_3fc = local_3f0[3];
        std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::push_back
                  ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffa20,
                   (value_type *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_fffffffffffffa20,
                   (value_type *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
      }
    }
    ncnn::Mat::~Mat((Mat *)0x4d371f);
  }
  qsort_descent_inplace<ncnn::Rect>
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffa20,
             (vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
  if ((0 < *(int *)(in_RDI + 0xd8)) &&
     (iVar9 = *(int *)(in_RDI + 0xd8),
     sVar4 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::size(&local_320),
     iVar9 < (int)sVar4)) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize
              ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffa30,
               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffa30,
               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4d37e9);
  nms_sorted_bboxes(in_stack_fffffffffffffad0,
                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                    in_stack_fffffffffffffac4);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_420);
  local_428 = (int)sVar4;
  this_00 = (Mat *)std::min<int>(&local_428,(int *)(in_RDI + 0xdc));
  local_424 = *(int *)&this_00->data;
  this_01 = (Mat *)0x0;
  local_430 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  ncnn::Mat::create(this_01,in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28,
                    (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                    CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                    (Allocator *)in_stack_fffffffffffffa10);
  bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffa10);
  iVar9 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa2c);
  if (bVar2) {
    local_4 = -100;
  }
  else {
    for (local_438 = 0; local_438 < local_424; local_438 = local_438 + 1) {
      ncnn::Mat::channel(this_00,(int)((ulong)this_01 >> 0x20));
      in_stack_fffffffffffffa20 =
           (vector<float,_std::allocator<float>_> *)ncnn::Mat::operator_cast_to_float_(&local_488);
      ncnn::Mat::~Mat((Mat *)0x4d394a);
      local_440 = in_stack_fffffffffffffa20;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_420,(long)local_438);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[](&local_320,*pvVar5);
      *(float *)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                  &local_440->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                 super__Vector_impl_data._M_start = pvVar6->x1;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_420,(long)local_438);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[](&local_320,*pvVar5);
      *(float *)((long)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                         &local_440->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                        super__Vector_impl_data._M_start + 4) = pvVar6->y1;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_420,(long)local_438);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[](&local_320,*pvVar5);
      *(float *)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                  &local_440->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                 super__Vector_impl_data._M_finish = pvVar6->x2;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_420,(long)local_438);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[](&local_320,*pvVar5);
      *(float *)((long)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                         &local_440->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                        super__Vector_impl_data._M_finish + 4) = pvVar6->y2;
    }
    sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
    if (1 < sVar4) {
      local_490 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,1);
      ncnn::Mat::create(this_01,iVar9,in_stack_fffffffffffffa28,
                        (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                        CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                        (Allocator *)in_stack_fffffffffffffa10);
      bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffa10);
      if (bVar2) {
        local_4 = -100;
        goto LAB_004d3bef;
      }
      for (local_494 = 0; local_494 < local_424; local_494 = local_494 + 1) {
        ncnn::Mat::channel(this_00,(int)((ulong)this_01 >> 0x20));
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_4e8);
        ncnn::Mat::~Mat((Mat *)0x4d3b5c);
        local_4a0 = pfVar3;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_420,(long)local_494);
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&local_338,*pvVar5);
        *local_4a0 = *pvVar7;
      }
    }
    local_4 = 0;
  }
LAB_004d3bef:
  local_434 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa20);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffa20);
  std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::~vector
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffa20);
  ncnn::Mat::~Mat((Mat *)0x4d3c23);
  return local_4;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i * w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = static_cast<float>(anchor_w * exp(dw));
                float pb_h = static_cast<float>(anchor_h * exp(dh));

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = {pb[0], pb[1], pb[2], pb[3]};
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<size_t> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i = 0; i < picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[picked[i]].x1;
        outptr[1] = proposal_boxes[picked[i]].y1;
        outptr[2] = proposal_boxes[picked[i]].x2;
        outptr[3] = proposal_boxes[picked[i]].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i = 0; i < picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[picked[i]];
        }
    }

    return 0;
}